

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# websocket.c
# Opt level: O0

void ws_read_finish(nni_ws *ws)

{
  nni_ws *ws_local;
  
  if ((ws->isstream & 1U) == 0) {
    ws_read_finish_msg(ws);
  }
  else {
    ws_read_finish_str(ws);
  }
  return;
}

Assistant:

static void
ws_read_finish(nni_ws *ws)
{
	if (ws->isstream) {
		ws_read_finish_str(ws);
	} else {
		ws_read_finish_msg(ws);
	}
}